

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> * __thiscall
kj::_::NullableValue<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::
operator=(NullableValue<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>
          *this,NullableValue<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>
                *other)

{
  OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *params;
  NullableValue<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> *other_local
  ;
  NullableValue<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::OneOf<kj::HttpInputStream::Request,kj::HttpInputStream::Connect>>
                (&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<kj::OneOf<kj::HttpInputStream::Request,kj::HttpInputStream::Connect>>
                         (&(other->field_1).value);
      ctor<kj::OneOf<kj::HttpInputStream::Request,kj::HttpInputStream::Connect>,kj::OneOf<kj::HttpInputStream::Request,kj::HttpInputStream::Connect>>
                (&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }